

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

void __thiscall helics::Federate::setProperty(Federate *this,int32_t option,double timeValue)

{
  element_type *peVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  long lVar2;
  
  lVar2 = 0x7fffffffffffffff;
  if (option == 0x98) {
    if (timeValue <= -9223372036.854765) {
      lVar2 = -0x7fffffffffffffff;
    }
    else if (timeValue < 9223372036.854765) {
      lVar2 = (long)(timeValue * 1000000000.0 +
                    *(double *)(&DAT_00429020 + (ulong)(0.0 <= timeValue * 1000000000.0) * 8));
    }
    (this->mStopTime).internalTimeCode = lVar2;
    return;
  }
  peVar1 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (timeValue <= -9223372036.854765) {
    lVar2 = -0x7fffffffffffffff;
  }
  else if (timeValue < 9223372036.854765) {
    lVar2 = (long)(timeValue * 1000000000.0 +
                  *(double *)(&DAT_00429020 + (ulong)(0.0 <= timeValue * 1000000000.0) * 8));
  }
  UNRECOVERED_JUMPTABLE = peVar1->_vptr_Core[0x1d];
  (*UNRECOVERED_JUMPTABLE)
            (peVar1,(ulong)(uint)(this->fedID).fid,(ulong)(uint)option,lVar2,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void Federate::setProperty(int32_t option, double timeValue)
{
    if (option == defs::Properties::STOPTIME) {
        mStopTime = timeValue;
        return;
    }
    coreObject->setTimeProperty(fedID, option, timeValue);
}